

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O0

void __thiscall
tchecker::details::expression_typechecker_t::visit
          (expression_typechecker_t *this,par_expression_t *expr)

{
  expression_type_t eVar1;
  expression_t *peVar2;
  element_type *peVar3;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined4 local_54;
  shared_ptr<tchecker::typed_par_expression_t> local_50 [2];
  undefined1 local_2c [4];
  undefined1 local_28 [4];
  expression_type_t expr_type;
  shared_ptr<tchecker::typed_expression_t> typed_sub_expr;
  par_expression_t *expr_local;
  expression_typechecker_t *this_local;
  
  typed_sub_expr.super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)expr;
  peVar2 = par_expression_t::expr(expr);
  (*peVar2->_vptr_expression_t[3])(peVar2,this);
  acquire_typed_expression((expression_typechecker_t *)local_28);
  peVar3 = std::
           __shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  eVar1 = typed_expression_t::type(peVar3);
  local_2c = (undefined1  [4])type_par(eVar1);
  std::
  make_shared<tchecker::typed_par_expression_t,tchecker::expression_type_t&,std::shared_ptr<tchecker::typed_expression_t>const&>
            ((expression_type_t *)local_50,(shared_ptr<tchecker::typed_expression_t> *)local_2c);
  std::shared_ptr<tchecker::typed_expression_t>::operator=(&this->_typed_expr,local_50);
  std::shared_ptr<tchecker::typed_par_expression_t>::~shared_ptr(local_50);
  if (local_2c == (undefined1  [4])0x0) {
    peVar3 = std::
             __shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
    eVar1 = typed_expression_t::type(peVar3);
    if (eVar1 != EXPR_TYPE_BAD) {
      expression_t::to_string_abi_cxx11_
                (&local_d8,
                 (expression_t *)
                 ((long)&(typed_sub_expr.
                          super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                 (long)(typed_sub_expr.
                        super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_vptr__Sp_counted_base[-7]));
      std::operator+(&local_b8,"in expression ",&local_d8);
      std::operator+(&local_98,&local_b8,", invalid parentheses around ");
      peVar2 = par_expression_t::expr
                         ((par_expression_t *)
                          typed_sub_expr.
                          super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi);
      expression_t::to_string_abi_cxx11_(&local_f8,peVar2);
      std::operator+(&local_78,&local_98,&local_f8);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&this->_error,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    local_54 = 0;
  }
  else {
    local_54 = 1;
  }
  std::shared_ptr<tchecker::typed_expression_t>::~shared_ptr
            ((shared_ptr<tchecker::typed_expression_t> *)local_28);
  return;
}

Assistant:

virtual void visit(tchecker::par_expression_t const & expr)
  {
    // Sub expression
    expr.expr().visit(*this);
    std::shared_ptr<tchecker::typed_expression_t> const typed_sub_expr{acquire_typed_expression()};

    // Typed expression
    enum tchecker::expression_type_t expr_type = type_par(typed_sub_expr->type());

    _typed_expr = std::make_shared<tchecker::typed_par_expression_t>(expr_type, typed_sub_expr);

    // Report bad type
    if (expr_type != tchecker::EXPR_TYPE_BAD)
      return;

    if (typed_sub_expr->type() != tchecker::EXPR_TYPE_BAD)
      _error("in expression " + expr.to_string() + ", invalid parentheses around " + expr.expr().to_string());
  }